

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressionTables.cpp
# Opt level: O3

uint16_t tableQuantize(uint16_t src,float errTol,float srcFloat,int doprint)

{
  undefined1 auVar1 [16];
  uint16_t uVar2;
  ushort *puVar3;
  uint uVar4;
  undefined6 in_register_0000003a;
  ulong uVar5;
  uint in_R8D;
  uint uVar6;
  uint uVar7;
  
  uVar5 = CONCAT62(in_register_0000003a,src);
  uVar4 = (uint)uVar5 - ((uint)(uVar5 >> 1) & 0x5555);
  uVar4 = (uVar4 >> 2 & 0x3333) + (uVar4 & 0x3333);
  uVar4 = (uVar4 >> 4) + uVar4 & 0xf0f;
  uVar7 = (uVar4 >> 8) + uVar4 & 0xff;
  uVar4 = (&internal_test_ns::closestDataOffset)[uVar5 & 0xffffffff];
  if (doprint != 0) {
    printf("TABLE 0x%04X %g bits %d tol %g\n",(double)srcFloat,(double)errTol,src,(ulong)uVar7);
  }
  puVar3 = &internal_test_ns::closestData + uVar4;
  if (3 < (ushort)uVar7) {
    do {
      auVar1._4_4_ = -(uint)(ABS(*(float *)(_imath_half_to_float_table + (ulong)puVar3[1] * 4) -
                                 srcFloat) < errTol);
      auVar1._0_4_ = -(uint)(ABS(*(float *)(_imath_half_to_float_table + (ulong)*puVar3 * 4) -
                                 srcFloat) < errTol);
      auVar1._8_4_ = -(uint)(ABS(*(float *)(_imath_half_to_float_table + (ulong)puVar3[2] * 4) -
                                 srcFloat) < errTol);
      auVar1._12_4_ =
           -(uint)(ABS(*(float *)(_imath_half_to_float_table + (ulong)puVar3[3] * 4) - srcFloat) <
                  errTol);
      in_R8D = movmskps(in_R8D,auVar1);
      uVar4 = (uint)puVar3[3];
      if ((in_R8D & 8) == 0) {
        uVar4 = (uint)uVar5;
      }
      uVar6 = (uint)puVar3[2];
      if ((in_R8D & 4) == 0) {
        uVar6 = uVar4;
      }
      if ((in_R8D & 2) != 0) {
        uVar6 = (uint)puVar3[1];
      }
      if ((in_R8D & 1) != 0) {
        uVar6 = (uint)*puVar3;
      }
      if ((uint16_t)uVar6 != src) {
        if (doprint != 0) {
          printf("    ===> 0x%04X\n",(ulong)(uVar6 & 0xffff));
        }
        return (uint16_t)uVar6;
      }
      puVar3 = puVar3 + 4;
      uVar7 = uVar7 - 4;
    } while (3 < uVar7);
  }
  uVar2 = (*(code *)(&DAT_00182d70 + *(int *)(&DAT_00182d70 + (ulong)uVar7 * 4)))();
  return uVar2;
}

Assistant:

static uint16_t tableQuantize (uint16_t src, float errTol, float srcFloat, int doprint)
{
    // pre-quantize float -> half and back
    //uint16_t src      = float_to_half (dctval);
    //float    srcFloat = imath_half_to_float (src);

    int             numSetBits = countSetBits (src);
    const uint16_t* closest    = internal_test_ns::closestData;
    closest += internal_test_ns::closestDataOffset[src];

    if (doprint)
    {
        printf ("TABLE 0x%04X %g bits %d tol %g\n", src, srcFloat, numSetBits, errTol);
    }

    while ( numSetBits >= 4 )
    {
        uint16_t tmp1 = closest[0];
        uint16_t tmp2 = closest[1];
        uint16_t tmp3 = closest[2];
        uint16_t tmp4 = closest[3];
        uint16_t res = src;

        // when compiling for f16c, gcc has no problem collapsing this
        // to 1 cvtph2ps and m128 float math assume the same will be
        // true for neon and ARM...
        float ft1 = fabsf (imath_half_to_float (tmp1) - srcFloat);
        float ft2 = fabsf (imath_half_to_float (tmp2) - srcFloat);
        float ft3 = fabsf (imath_half_to_float (tmp3) - srcFloat);
        float ft4 = fabsf (imath_half_to_float (tmp4) - srcFloat);

        // do in reverse order such that vectorizer can more easily notice the
        // similar comparisons and do the mask and reduce
        if (ft4 < errTol) res = tmp4;
        if (ft3 < errTol) res = tmp3;
        if (ft2 < errTol) res = tmp2;
        if (ft1 < errTol) res = tmp1;

        if (res != src)
        {
            numSetBits = 0;
            src = res;
            break;
        }

        closest += 4;
        numSetBits -= 4;
    }

    switch (numSetBits)
    {
        case 3:
            if (fabsf (imath_half_to_float (closest[0]) - srcFloat) < errTol)
            {
                src = closest[0];
            }
            else if (fabsf (imath_half_to_float (closest[1]) - srcFloat) < errTol)
            {
                src = closest[1];
            }
            else if (fabsf (imath_half_to_float (closest[2]) - srcFloat) < errTol)
            {
                src = closest[2];
            }
            break;
        case 2:
            if (fabsf (imath_half_to_float (closest[0]) - srcFloat) < errTol)
            {
                src = closest[0];
            }
            else if (fabsf (imath_half_to_float (closest[1]) - srcFloat) < errTol)
            {
                src = closest[1];
            }
            break;
        case 1:
            if (fabsf (imath_half_to_float (closest[0]) - srcFloat) < errTol)
            {
                src = closest[0];
            }
            break;
        default:
            break;
    }
#if 0
    for (int targetNumSetBits = numSetBits - 1;
          targetNumSetBits >= 0;
          --targetNumSetBits)
     {
         uint16_t tmp = *closest;

         if (doprint)
             printf ("  consider 0x%04X %g => %g < %g\n", tmp,
                     imath_half_to_float (tmp),
                     fabsf (imath_half_to_float (tmp) - srcFloat),
                     errTol);
         if (fabsf (imath_half_to_float (tmp) - srcFloat) < errTol)
         {
             if (doprint)
                 printf ("    ===> tbits %d 0x%04X\n", targetNumSetBits, tmp);
             return tmp;
         }

         closest++;
     }
     if (doprint)
         printf ("    ===> nothing better 0x%04X\n", src);
#else
     if (doprint)
         printf ("    ===> 0x%04X\n", src);
#endif

     return src;
}